

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-stream.c
# Opt level: O1

hd_stream *
pdf_open_raw_filter(hd_context *ctx,hd_stream *chain,pdf_document *doc,pdf_obj *stmobj,int num,
                   int *orig_num,int *orig_gen,hd_off_t offset)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  pdf_xref_entry *ppVar3;
  hd_stream *phVar4;
  pdf_obj *obj;
  hd_stream *local_38;
  
  local_38 = chain;
  iVar2 = pdf_xref_len(ctx,doc);
  if (num < iVar2) {
    ppVar3 = pdf_get_xref_entry(ctx,doc,num);
    *orig_num = ppVar3->num;
    *orig_gen = (uint)ppVar3->gen;
    if (ppVar3->stm_buf != (hd_buffer *)0x0) {
      phVar4 = hd_open_buffer(ctx,ppVar3->stm_buf);
      return phVar4;
    }
  }
  else {
    *orig_num = num;
    *orig_gen = 0;
  }
  hd_var_imp(&local_38);
  iVar2 = hd_push_try(ctx);
  if ((iVar2 != 0) && (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 == 0)) {
    obj = pdf_dict_get(ctx,stmobj,(pdf_obj *)0xda);
    iVar2 = pdf_to_int(ctx,obj);
    phVar4 = hd_keep_stream(ctx,local_38);
    local_38 = (hd_stream *)0x0;
    local_38 = hd_open_null(ctx,phVar4,iVar2,offset);
  }
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    return local_38;
  }
  hd_drop_stream(ctx,local_38);
  hd_rethrow(ctx);
}

Assistant:

static hd_stream *
pdf_open_raw_filter(hd_context *ctx, hd_stream *chain, pdf_document *doc, pdf_obj *stmobj, int num, int *orig_num, int *orig_gen, hd_off_t offset)
{
    pdf_xref_entry *x = NULL;
    hd_stream *chain2;
    int len;

    if (num > 0 && num < pdf_xref_len(ctx, doc))
    {
        x = pdf_get_xref_entry(ctx, doc, num);
        *orig_num = x->num;
        *orig_gen = x->gen;
        if (x->stm_buf)
            return hd_open_buffer(ctx, x->stm_buf);
    }
    else
    {
        /* We only end up here when called from pdf_open_stream_with_offset to parse new format XRef sections. */
        /* New style XRef sections must have generation number 0. */
        *orig_num = num;
        *orig_gen = 0;
    }

    hd_var(chain);

    hd_try(ctx)
    {
        len = pdf_to_int(ctx, pdf_dict_get(ctx, stmobj, PDF_NAME_Length));

        /* don't close chain when we close this filter */
        chain2 = hd_keep_stream(ctx, chain);
        chain = NULL;
        chain = hd_open_null(ctx, chain2, len, offset);

    }
    hd_catch(ctx)
    {
        hd_drop_stream(ctx, chain);
        hd_rethrow(ctx);
    }

    return chain;
}